

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O2

int __thiscall ON_Brep::RemoveWireEdges(ON_Brep *this,bool bDeleteVertices)

{
  uint uVar1;
  ON_BrepEdge *pOVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  
  uVar1 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_count;
  uVar3 = 0;
  uVar6 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar6 = uVar3;
  }
  iVar5 = 0;
  for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    pOVar2 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
    if ((uVar4 == *(uint *)((long)pOVar2->m_vi + (uVar3 - 8))) &&
       (*(int *)((long)pOVar2->m_vi + uVar3 + 0x1c) == 0)) {
      iVar5 = iVar5 + 1;
      DeleteEdge(this,(ON_BrepEdge *)
                      ((long)&(((ON_CurveProxy *)
                               (&(pOVar2->super_ON_CurveProxy).m_real_curve_domain + -2))->
                              super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object +
                      uVar3),bDeleteVertices);
    }
    uVar3 = uVar3 + 0x88;
  }
  return iVar5;
}

Assistant:

int ON_Brep::RemoveWireEdges( bool bDeleteVertices )
{
  int rc = 0;
  int ei, count = m_E.Count();
  for ( ei = 0; ei < count; ei++ )
  {
    if ( ei == m_E[ei].m_edge_index && 0 == m_E[ei].m_ti.Count() )
    {
      rc++;
      DeleteEdge( m_E[ei], bDeleteVertices );
    }
  }
  return rc;
}